

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  HierarchicalVisitor *in_RSI;
  Expression *in_RDI;
  Expression *unaff_retaddr;
  
  visitExpression<slang::ast::Expression_const,(anonymous_namespace)::HierarchicalVisitor&>
            (unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}